

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O3

Color * sf::operator+=(Color *left,Color *right)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (uint)right->r + (uint)left->r;
  if (0xfe < uVar1) {
    uVar1 = 0xff;
  }
  uVar2 = (uint)right->g + (uint)left->g;
  if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  uVar4 = (uint)right->b + (uint)left->b;
  if (0xfe < uVar4) {
    uVar4 = 0xff;
  }
  uVar3 = (uint)right->a + (uint)left->a;
  if (0xfe < uVar3) {
    uVar3 = 0xff;
  }
  *left = (Color)(uVar2 << 8 | uVar1 | uVar4 << 0x10 | uVar3 << 0x18);
  return left;
}

Assistant:

Color& operator +=(Color& left, const Color& right)
{
    return left = left + right;
}